

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void extend_frame_highbd(uint16_t *data,int width,int height,ptrdiff_t stride,int border_horz,
                        int border_vert)

{
  int iVar1;
  undefined2 *puVar2;
  void *__src;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int j;
  int i;
  uint16_t *data_p;
  int local_30;
  int local_2c;
  
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
    puVar2 = (undefined2 *)(in_RDI + local_2c * in_RCX * 2);
    for (local_30 = -in_R8D; iVar1 = in_ESI, local_30 < 0; local_30 = local_30 + 1) {
      puVar2[local_30] = *puVar2;
    }
    while (local_30 = iVar1, local_30 < in_ESI + in_R8D) {
      puVar2[local_30] = puVar2[in_ESI + -1];
      iVar1 = local_30 + 1;
    }
  }
  __src = (void *)(in_RDI + (long)in_R8D * -2);
  for (local_2c = -in_R9D; iVar1 = in_EDX, local_2c < 0; local_2c = local_2c + 1) {
    memcpy((void *)((long)__src + local_2c * in_RCX * 2),__src,(long)(in_ESI + in_R8D * 2) << 1);
  }
  while (local_2c = iVar1, local_2c < in_EDX + in_R9D) {
    memcpy((void *)((long)__src + local_2c * in_RCX * 2),
           (void *)((long)__src + (in_EDX + -1) * in_RCX * 2),(long)(in_ESI + in_R8D * 2) << 1);
    iVar1 = local_2c + 1;
  }
  return;
}

Assistant:

static void extend_frame_highbd(uint16_t *data, int width, int height,
                                ptrdiff_t stride, int border_horz,
                                int border_vert) {
  uint16_t *data_p;
  int i, j;
  for (i = 0; i < height; ++i) {
    data_p = data + i * stride;
    for (j = -border_horz; j < 0; ++j) data_p[j] = data_p[0];
    for (j = width; j < width + border_horz; ++j) data_p[j] = data_p[width - 1];
  }
  data_p = data - border_horz;
  for (i = -border_vert; i < 0; ++i) {
    memcpy(data_p + i * stride, data_p,
           (width + 2 * border_horz) * sizeof(uint16_t));
  }
  for (i = height; i < height + border_vert; ++i) {
    memcpy(data_p + i * stride, data_p + (height - 1) * stride,
           (width + 2 * border_horz) * sizeof(uint16_t));
  }
}